

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_set_car(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  byte bVar1;
  uint64_t in_RDX;
  operand local_64 [3];
  string error;
  string local_38;
  
  this = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar1 = ops->safe_primitives;
  if ((bool)bVar1 == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_38,this,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = ops->safe_primitives;
  }
  if ((bVar1 & 1) != 0) {
    local_38._M_dataplus._M_p._0_4_ = 5;
    local_64[0] = R11;
    local_64[2] = 0x39;
    local_64[1] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_38,local_64,local_64 + 2,(int *)(local_64 + 1));
    local_38._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_38,&error);
    jump_short_if_arg_is_not_block(code,RCX,R11,&error);
  }
  local_64[0] = AH;
  local_64[2] = 0xb;
  local_64[1] = 0x39;
  local_38._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_64,local_64 + 2,local_64 + 1,(unsigned_long *)&local_38);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RCX,R11,&error);
  }
  local_38._M_dataplus._M_p._0_4_ = 0x40;
  local_64[0] = MEM_RCX;
  local_64[2] = 8;
  local_64[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_64,(int *)(local_64 + 2),local_64 + 1);
  local_38._M_dataplus._M_p._0_4_ = 0x2c;
  local_64[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_64);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_set_car_contract_violation);
  }
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_set_car(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  if (ops.safe_primitives)
    {
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether it contains a pair
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_pair(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(1), asmcode::RDX);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_set_car_contract_violation);
    }
  }